

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::format_uint<4u,char,unsigned_long>
                 (char *buffer,unsigned_long value,int num_digits,bool upper)

{
  char *pcVar1;
  uint digit;
  char *digits;
  char *end;
  bool upper_local;
  unsigned_long uStack_18;
  int num_digits_local;
  unsigned_long value_local;
  char *buffer_local;
  
  uStack_18 = value;
  value_local = (unsigned_long)(buffer + num_digits);
  do {
    pcVar1 = "0123456789abcdef";
    if (upper) {
      pcVar1 = "0123456789ABCDEF";
    }
    *(char *)(value_local - 1) = pcVar1[(uint)uStack_18 & 0xf];
    uStack_18 = uStack_18 >> 4;
    value_local = value_local - 1;
  } while (uStack_18 != 0);
  return buffer + num_digits;
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}